

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O0

array<unsigned_long,_6UL> * __thiscall
Omega_h::Overlay::get_cell_faces
          (array<unsigned_long,_6UL> *__return_storage_ptr__,Overlay *this,size_t cell)

{
  int iVar1;
  reference pvVar2;
  ulong local_a0;
  size_t i;
  Adj local_88;
  undefined1 local_58 [8];
  LOs cells2faces;
  size_t cell_local;
  Overlay *this_local;
  
  cells2faces.write_.shared_alloc_.direct_ptr = (void *)cell;
  Omega_h::Mesh::get_adj(&local_88,&this->mesh,3,2);
  Read<int>::Read((Read<int> *)local_58,&local_88.super_Graph.ab2b);
  Adj::~Adj(&local_88);
  for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
    iVar1 = *(int *)((long)&(cells2faces.write_.shared_alloc_.alloc)->size +
                    (long)((int)cells2faces.write_.shared_alloc_.direct_ptr * 6 + (int)local_a0) * 4
                    );
    pvVar2 = std::array<unsigned_long,_6UL>::operator[](__return_storage_ptr__,local_a0);
    *pvVar2 = (long)iVar1;
  }
  Read<int>::~Read((Read<int> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::array<size_t, 6> Overlay::get_cell_faces(size_t cell) const {
  std::array<size_t, 6> faces;
  auto cells2faces = mesh.get_adj(REGION, FACE).ab2b;
  for (size_t i = 0; i < 6; ++i) {
    faces[i] = size_t(cells2faces[LO(cell * 6 + i)]);
  }
  return faces;
}